

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::Namespace::addSpecialisationParameter(Namespace *this,NamespaceAliasDeclaration *n)

{
  pool_ref<soul::AST::NamespaceAliasDeclaration> local_20;
  
  local_20.object = n;
  std::
  vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>>
  ::emplace_back<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>
            ((vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>>
              *)&(this->super_ModuleBase).namespaceAliases,&local_20);
  local_20.object = n;
  std::
  vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>
  ::emplace_back<soul::pool_ref<soul::AST::ASTObject>>
            ((vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>
              *)&(this->super_ModuleBase).specialisationParams,
             (pool_ref<soul::AST::ASTObject> *)&local_20);
  return;
}

Assistant:

void addSpecialisationParameter (NamespaceAliasDeclaration& n) override
        {
            namespaceAliases.push_back (n);
            specialisationParams.push_back (n);
        }